

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn4.hpp
# Opt level: O3

void __thiscall trng::yarn4::split(yarn4 *this,uint s,uint n)

{
  uint uVar1;
  uint uVar2;
  int32_t iVar3;
  int iVar4;
  ulong uVar5;
  uint i_7;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int32_t iVar11;
  uint i;
  uint uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  int32_t iVar20;
  bool bVar21;
  int32_t b [16];
  int32_t a [4];
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  int32_t local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  int32_t local_68;
  int32_t local_64;
  uint local_60;
  uint local_5c;
  int32_t local_58;
  int32_t local_54;
  int32_t local_50;
  uint local_4c;
  int32_t local_48;
  int32_t iStack_44;
  int32_t iStack_40;
  int iStack_3c;
  
  if (s <= n) {
    std::invalid_argument::invalid_argument
              ((invalid_argument *)&local_88,"invalid argument for trng::yarn4::split");
    utility::throw_this<std::invalid_argument>((invalid_argument *)&local_88);
    std::invalid_argument::~invalid_argument((invalid_argument *)&local_88);
  }
  if (1 < s) {
    uVar5 = (ulong)n + 1;
    if (n < 0xf) {
      uVar12 = (this->S).r[0];
      uVar14 = (this->S).r[1];
      uVar8 = (this->S).r[2];
      uVar15 = (this->S).r[3];
      do {
        uVar10 = uVar8;
        uVar8 = uVar14;
        uVar14 = uVar12;
        uVar16 = (long)(int)uVar15 * (long)(this->P).a[3] + (long)(int)uVar10 * (long)(this->P).a[2]
                 + (long)(int)uVar8 * (long)(this->P).a[1] +
                   (long)(int)uVar14 * (long)(this->P).a[0];
        uVar17 = (uVar16 >> 0x1f) + (uVar16 & 0x7fffffff);
        uVar16 = uVar17 - 0x1fffffffc;
        if (uVar17 < 0x1fffffffc) {
          uVar16 = uVar17;
        }
        uVar17 = uVar16 - 0xfffffffe;
        if (uVar16 < 0xfffffffe) {
          uVar17 = uVar16;
        }
        uVar12 = (uint)uVar17 + 0x80000001;
        if (uVar17 < 0x7fffffff) {
          uVar12 = (uint)uVar17;
        }
        uVar1 = (int)uVar5 - 1;
        uVar5 = (ulong)uVar1;
        uVar15 = uVar10;
      } while (uVar1 != 0);
      (this->S).r[0] = uVar12;
      (this->S).r[1] = uVar14;
      (this->S).r[2] = uVar8;
      (this->S).r[3] = uVar10;
    }
    else {
      uVar12 = 0;
      do {
        if ((uVar5 & 1) != 0) {
          jump2(this,uVar12);
        }
        uVar12 = uVar12 + 1;
        bVar21 = 1 < uVar5;
        uVar5 = uVar5 >> 1;
      } while (bVar21);
      uVar12 = (this->S).r[0];
    }
    uVar5 = (ulong)s;
    if (s < 0x10) {
      uVar17 = (ulong)uVar12;
      uVar16 = uVar5;
      iVar4 = (this->S).r[1];
      iVar19 = (this->S).r[2];
      iVar13 = (this->S).r[3];
      do {
        iVar6 = iVar19;
        iVar19 = iVar4;
        iVar4 = (int)uVar17;
        uVar17 = (long)iVar13 * (long)(this->P).a[3] + (long)iVar6 * (long)(this->P).a[2] +
                 (long)iVar19 * (long)(this->P).a[1] + (long)iVar4 * (long)(this->P).a[0];
        uVar18 = (uVar17 >> 0x1f) + (uVar17 & 0x7fffffff);
        uVar17 = uVar18 - 0x1fffffffc;
        if (uVar18 < 0x1fffffffc) {
          uVar17 = uVar18;
        }
        uVar18 = uVar17 - 0xfffffffe;
        if (uVar17 < 0xfffffffe) {
          uVar18 = uVar17;
        }
        uVar17 = (ulong)((int)uVar18 + 0x80000001);
        if (uVar18 < 0x7fffffff) {
          uVar17 = uVar18 & 0xffffffff;
        }
        uVar14 = (uint)uVar17;
        uVar8 = (int)uVar16 - 1;
        uVar16 = (ulong)uVar8;
        iVar13 = iVar6;
      } while (uVar8 != 0);
      (this->S).r[0] = uVar14;
      (this->S).r[1] = iVar4;
      (this->S).r[2] = iVar19;
      (this->S).r[3] = iVar6;
    }
    else {
      uVar14 = 0;
      uVar16 = uVar5;
      do {
        if ((uVar16 & 1) != 0) {
          jump2(this,uVar14);
        }
        uVar14 = uVar14 + 1;
        bVar21 = 1 < uVar16;
        uVar16 = uVar16 >> 1;
      } while (bVar21);
      uVar14 = (this->S).r[0];
    }
    if (s < 0x10) {
      uVar15 = (this->S).r[1];
      uVar10 = (this->S).r[2];
      uVar1 = (this->S).r[3];
      uVar8 = uVar14;
      uVar9 = s;
      do {
        uVar2 = uVar8;
        uVar7 = uVar10;
        uVar10 = uVar15;
        uVar16 = (long)(int)uVar1 * (long)(this->P).a[3] + (long)(int)uVar7 * (long)(this->P).a[2] +
                 (long)(int)uVar10 * (long)(this->P).a[1] + (long)(int)uVar2 * (long)(this->P).a[0];
        uVar17 = (uVar16 >> 0x1f) + (uVar16 & 0x7fffffff);
        uVar16 = uVar17 - 0x1fffffffc;
        if (uVar17 < 0x1fffffffc) {
          uVar16 = uVar17;
        }
        uVar17 = uVar16 - 0xfffffffe;
        if (uVar16 < 0xfffffffe) {
          uVar17 = uVar16;
        }
        uVar8 = (uint)uVar17 + 0x80000001;
        if (uVar17 < 0x7fffffff) {
          uVar8 = (uint)uVar17;
        }
        uVar9 = uVar9 - 1;
        uVar15 = uVar2;
        uVar1 = uVar7;
      } while (uVar9 != 0);
      (this->S).r[0] = uVar8;
      (this->S).r[1] = uVar2;
      (this->S).r[2] = uVar10;
      (this->S).r[3] = uVar7;
    }
    else {
      uVar8 = 0;
      uVar16 = uVar5;
      do {
        if ((uVar16 & 1) != 0) {
          jump2(this,uVar8);
        }
        uVar8 = uVar8 + 1;
        bVar21 = 1 < uVar16;
        uVar16 = uVar16 >> 1;
      } while (bVar21);
      uVar8 = (this->S).r[0];
    }
    uVar16 = (ulong)uVar8;
    if (s < 0x10) {
      iVar4 = (this->S).r[1];
      iVar19 = (this->S).r[2];
      iVar13 = (this->S).r[3];
      uVar10 = s;
      do {
        iVar6 = iVar19;
        iVar19 = iVar4;
        iVar4 = (int)uVar16;
        uVar16 = (long)iVar13 * (long)(this->P).a[3] + (long)iVar6 * (long)(this->P).a[2] +
                 (long)iVar19 * (long)(this->P).a[1] + (long)iVar4 * (long)(this->P).a[0];
        uVar17 = (uVar16 >> 0x1f) + (uVar16 & 0x7fffffff);
        uVar16 = uVar17 - 0x1fffffffc;
        if (uVar17 < 0x1fffffffc) {
          uVar16 = uVar17;
        }
        uVar17 = uVar16 - 0xfffffffe;
        if (uVar16 < 0xfffffffe) {
          uVar17 = uVar16;
        }
        uVar16 = (ulong)((int)uVar17 + 0x80000001);
        if (uVar17 < 0x7fffffff) {
          uVar16 = uVar17 & 0xffffffff;
        }
        uVar15 = (uint)uVar16;
        uVar10 = uVar10 - 1;
        iVar13 = iVar6;
      } while (uVar10 != 0);
      (this->S).r[0] = uVar15;
      (this->S).r[1] = iVar4;
      (this->S).r[2] = iVar19;
      (this->S).r[3] = iVar6;
    }
    else {
      uVar15 = 0;
      uVar16 = uVar5;
      do {
        if ((uVar16 & 1) != 0) {
          jump2(this,uVar15);
        }
        uVar15 = uVar15 + 1;
        bVar21 = 1 < uVar16;
        uVar16 = uVar16 >> 1;
      } while (bVar21);
      uVar15 = (this->S).r[0];
    }
    if (s < 0x10) {
      uVar16 = (ulong)uVar15;
      iVar4 = (this->S).r[1];
      iVar19 = (this->S).r[2];
      iVar13 = (this->S).r[3];
      uVar10 = s;
      do {
        iVar6 = iVar19;
        iVar19 = iVar4;
        iVar4 = (int)uVar16;
        uVar16 = (long)iVar13 * (long)(this->P).a[3] + (long)iVar6 * (long)(this->P).a[2] +
                 (long)iVar19 * (long)(this->P).a[1] + (long)iVar4 * (long)(this->P).a[0];
        uVar17 = (uVar16 >> 0x1f) + (uVar16 & 0x7fffffff);
        uVar16 = uVar17 - 0x1fffffffc;
        if (uVar17 < 0x1fffffffc) {
          uVar16 = uVar17;
        }
        uVar17 = uVar16 - 0xfffffffe;
        if (uVar16 < 0xfffffffe) {
          uVar17 = uVar16;
        }
        uVar16 = (ulong)((int)uVar17 + 0x80000001);
        if (uVar17 < 0x7fffffff) {
          uVar16 = uVar17 & 0xffffffff;
        }
        uVar10 = uVar10 - 1;
        iVar13 = iVar6;
      } while (uVar10 != 0);
      (this->S).r[0] = (int)uVar16;
      (this->S).r[1] = iVar4;
      (this->S).r[2] = iVar19;
      (this->S).r[3] = iVar6;
    }
    else {
      uVar10 = 0;
      uVar16 = uVar5;
      do {
        if ((uVar16 & 1) != 0) {
          jump2(this,uVar10);
        }
        uVar10 = uVar10 + 1;
        bVar21 = 1 < uVar16;
        uVar16 = uVar16 >> 1;
      } while (bVar21);
      uVar16 = (ulong)(uint)(this->S).r[0];
    }
    iVar3 = (int32_t)uVar16;
    if (s < 0x10) {
      iVar4 = (this->S).r[1];
      iVar19 = (this->S).r[2];
      iVar13 = (this->S).r[3];
      uVar10 = s;
      do {
        iVar6 = iVar19;
        iVar19 = iVar4;
        iVar4 = (int)uVar16;
        uVar16 = (long)iVar13 * (long)(this->P).a[3] + (long)iVar6 * (long)(this->P).a[2] +
                 (long)iVar19 * (long)(this->P).a[1] + (long)iVar4 * (long)(this->P).a[0];
        uVar17 = (uVar16 >> 0x1f) + (uVar16 & 0x7fffffff);
        uVar16 = uVar17 - 0x1fffffffc;
        if (uVar17 < 0x1fffffffc) {
          uVar16 = uVar17;
        }
        uVar17 = uVar16 - 0xfffffffe;
        if (uVar16 < 0xfffffffe) {
          uVar17 = uVar16;
        }
        uVar16 = (ulong)((int)uVar17 + 0x80000001);
        if (uVar17 < 0x7fffffff) {
          uVar16 = uVar17 & 0xffffffff;
        }
        uVar10 = uVar10 - 1;
        iVar13 = iVar6;
      } while (uVar10 != 0);
      (this->S).r[0] = (int)uVar16;
      (this->S).r[1] = iVar4;
      (this->S).r[2] = iVar19;
      (this->S).r[3] = iVar6;
    }
    else {
      uVar10 = 0;
      uVar16 = uVar5;
      do {
        if ((uVar16 & 1) != 0) {
          jump2(this,uVar10);
        }
        uVar10 = uVar10 + 1;
        bVar21 = 1 < uVar16;
        uVar16 = uVar16 >> 1;
      } while (bVar21);
      uVar16 = (ulong)(uint)(this->S).r[0];
    }
    iVar20 = (int32_t)uVar16;
    if (s < 0x10) {
      iVar4 = (this->S).r[1];
      iVar19 = (this->S).r[2];
      iVar13 = (this->S).r[3];
      uVar10 = s;
      do {
        iVar6 = iVar19;
        iVar19 = iVar4;
        iVar4 = (int)uVar16;
        uVar16 = (long)iVar13 * (long)(this->P).a[3] + (long)iVar6 * (long)(this->P).a[2] +
                 (long)iVar19 * (long)(this->P).a[1] + (long)iVar4 * (long)(this->P).a[0];
        uVar17 = (uVar16 >> 0x1f) + (uVar16 & 0x7fffffff);
        uVar16 = uVar17 - 0x1fffffffc;
        if (uVar17 < 0x1fffffffc) {
          uVar16 = uVar17;
        }
        uVar17 = uVar16 - 0xfffffffe;
        if (uVar16 < 0xfffffffe) {
          uVar17 = uVar16;
        }
        uVar16 = (ulong)((int)uVar17 + 0x80000001);
        if (uVar17 < 0x7fffffff) {
          uVar16 = uVar17 & 0xffffffff;
        }
        uVar10 = uVar10 - 1;
        iVar13 = iVar6;
      } while (uVar10 != 0);
      (this->S).r[0] = (int)uVar16;
      (this->S).r[1] = iVar4;
      (this->S).r[2] = iVar19;
      (this->S).r[3] = iVar6;
    }
    else {
      uVar10 = 0;
      uVar16 = uVar5;
      do {
        if ((uVar16 & 1) != 0) {
          jump2(this,uVar10);
        }
        uVar10 = uVar10 + 1;
        bVar21 = 1 < uVar16;
        uVar16 = uVar16 >> 1;
      } while (bVar21);
      uVar16 = (ulong)(uint)(this->S).r[0];
    }
    iVar11 = (int32_t)uVar16;
    if (s < 0x10) {
      iVar4 = (this->S).r[1];
      iVar19 = (this->S).r[2];
      iVar13 = (this->S).r[3];
      do {
        iVar6 = iVar19;
        iVar19 = iVar4;
        iVar4 = (int)uVar16;
        uVar5 = (long)iVar13 * (long)(this->P).a[3] + (long)iVar6 * (long)(this->P).a[2] +
                (long)iVar19 * (long)(this->P).a[1] + (long)iVar4 * (long)(this->P).a[0];
        uVar16 = (uVar5 >> 0x1f) + (uVar5 & 0x7fffffff);
        uVar5 = uVar16 - 0x1fffffffc;
        if (uVar16 < 0x1fffffffc) {
          uVar5 = uVar16;
        }
        uVar17 = uVar5 - 0xfffffffe;
        if (uVar5 < 0xfffffffe) {
          uVar17 = uVar5;
        }
        uVar16 = (ulong)((int)uVar17 + 0x80000001);
        if (uVar17 < 0x7fffffff) {
          uVar16 = uVar17 & 0xffffffff;
        }
        iStack_3c = (int)uVar16;
        s = s - 1;
        iVar13 = iVar6;
      } while (s != 0);
      (this->S).r[0] = iStack_3c;
      (this->S).r[1] = iVar4;
      (this->S).r[2] = iVar19;
      (this->S).r[3] = iVar6;
    }
    else {
      uVar10 = 0;
      do {
        if ((uVar5 & 1) != 0) {
          jump2(this,uVar10);
        }
        uVar10 = uVar10 + 1;
        bVar21 = 1 < uVar5;
        uVar5 = uVar5 >> 1;
      } while (bVar21);
      iStack_3c = (this->S).r[0];
    }
    local_88 = uVar15;
    local_84 = uVar8;
    local_80 = uVar14;
    local_7c = uVar12;
    local_78 = iVar3;
    local_74 = uVar15;
    local_70 = uVar8;
    local_6c = uVar14;
    local_68 = iVar20;
    local_64 = iVar3;
    local_60 = uVar15;
    local_5c = uVar8;
    local_58 = iVar11;
    local_54 = iVar20;
    local_50 = iVar3;
    local_4c = uVar15;
    local_48 = iVar3;
    iStack_44 = iVar20;
    iStack_40 = iVar11;
    int_math::gauss<4>((int32_t (*) [16])&local_88,(int32_t (*) [4])&local_48,0x7fffffff);
    *(ulong *)(this->P).a = CONCAT44(iStack_44,local_48);
    *(ulong *)((this->P).a + 2) = CONCAT44(iStack_3c,iStack_40);
    (this->S).r[0] = uVar15;
    (this->S).r[1] = uVar8;
    (this->S).r[2] = uVar14;
    (this->S).r[3] = uVar12;
    iVar4 = 4;
    do {
      backward(this);
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void yarn4::split(unsigned int s, unsigned int n) {
#if !(defined TRNG_CUDA)
    if (s < 1 or n >= s)
      utility::throw_this(std::invalid_argument("invalid argument for trng::yarn4::split"));
#endif
    if (s > 1) {
      jump(n + 1ull);
      const int32_t q0{S.r[0]};
      jump(s);
      const int32_t q1{S.r[0]};
      jump(s);
      const int32_t q2{S.r[0]};
      jump(s);
      const int32_t q3{S.r[0]};
      jump(s);
      const int32_t q4{S.r[0]};
      jump(s);
      const int32_t q5{S.r[0]};
      jump(s);
      const int32_t q6{S.r[0]};
      jump(s);
      const int32_t q7{S.r[0]};
      int32_t a[4], b[16];
      a[0] = q4;
      b[0] = q3;
      b[1] = q2;
      b[2] = q1;
      b[3] = q0;
      a[1] = q5;
      b[4] = q4;
      b[5] = q3;
      b[6] = q2;
      b[7] = q1;
      a[2] = q6;
      b[8] = q5;
      b[9] = q4;
      b[10] = q3;
      b[11] = q2;
      a[3] = q7;
      b[12] = q6;
      b[13] = q5;
      b[14] = q4;
      b[15] = q3;
      int_math::gauss<4>(b, a, modulus);
      P.a[0] = a[0];
      P.a[1] = a[1];
      P.a[2] = a[2];
      P.a[3] = a[3];
      S.r[0] = q3;
      S.r[1] = q2;
      S.r[2] = q1;
      S.r[3] = q0;
      for (int i{0}; i < 4; ++i)
        backward();
    }
  }